

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabBarQueueReorderFromMousePos
               (ImGuiTabBar *tab_bar,ImGuiTabItem *src_tab,ImVec2 mouse_pos)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  int iVar4;
  ImGuiTabItem *pIVar5;
  float local_58;
  float x2;
  float x1;
  ImGuiTabItem *dst_tab;
  int i;
  int dst_idx;
  int src_idx;
  int dir;
  float bar_offset;
  bool is_central_section;
  ImGuiContext *g;
  ImGuiTabItem *src_tab_local;
  ImGuiTabBar *tab_bar_local;
  ImVec2 mouse_pos_local;
  
  pIVar2 = GImGui;
  if (tab_bar->ReorderRequestTabId != 0) {
    __assert_fail("tab_bar->ReorderRequestTabId == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                  ,0x1e37,
                  "void ImGui::TabBarQueueReorderFromMousePos(ImGuiTabBar *, const ImGuiTabItem *, ImVec2)"
                 );
  }
  if ((tab_bar->Flags & 1U) != 0) {
    if ((src_tab->Flags & 0xc0U) == 0) {
      local_58 = tab_bar->ScrollingTarget;
    }
    else {
      local_58 = 0.0;
    }
    local_58 = (tab_bar->BarRect).Min.x - local_58;
    tab_bar_local._0_4_ = mouse_pos.x;
    iVar3 = 1;
    if (tab_bar_local._0_4_ < local_58 + src_tab->Offset) {
      iVar3 = -1;
    }
    iVar4 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,src_tab);
    dst_tab._0_4_ = iVar4;
    dst_tab._4_4_ = iVar4;
    while( true ) {
      bVar1 = false;
      if (-1 < (int)dst_tab) {
        bVar1 = (int)dst_tab < (tab_bar->Tabs).Size;
      }
      if (((!bVar1) ||
          (pIVar5 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,(int)dst_tab),
          (pIVar5->Flags & 0x20U) != 0)) || ((pIVar5->Flags & 0xc0U) != (src_tab->Flags & 0xc0U)))
      break;
      dst_tab._4_4_ = (int)dst_tab;
      if (((iVar3 < 0) &&
          ((local_58 + pIVar5->Offset) - (pIVar2->Style).ItemInnerSpacing.x < tab_bar_local._0_4_))
         || ((0 < iVar3 &&
             (tab_bar_local._0_4_ <
              local_58 + pIVar5->Offset + pIVar5->Width + (pIVar2->Style).ItemInnerSpacing.x))))
      break;
      dst_tab._0_4_ = iVar3 + (int)dst_tab;
    }
    if (dst_tab._4_4_ != iVar4) {
      TabBarQueueReorder(tab_bar,src_tab,dst_tab._4_4_ - iVar4);
    }
  }
  return;
}

Assistant:

void ImGui::TabBarQueueReorderFromMousePos(ImGuiTabBar* tab_bar, const ImGuiTabItem* src_tab, ImVec2 mouse_pos)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(tab_bar->ReorderRequestTabId == 0);
    if ((tab_bar->Flags & ImGuiTabBarFlags_Reorderable) == 0)
        return;

    const bool is_central_section = (src_tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    const float bar_offset = tab_bar->BarRect.Min.x - (is_central_section ? tab_bar->ScrollingTarget : 0);

    // Count number of contiguous tabs we are crossing over
    const int dir = (bar_offset + src_tab->Offset) > mouse_pos.x ? -1 : +1;
    const int src_idx = tab_bar->Tabs.index_from_ptr(src_tab);
    int dst_idx = src_idx;
    for (int i = src_idx; i >= 0 && i < tab_bar->Tabs.Size; i += dir)
    {
        // Reordered tabs must share the same section
        const ImGuiTabItem* dst_tab = &tab_bar->Tabs[i];
        if (dst_tab->Flags & ImGuiTabItemFlags_NoReorder)
            break;
        if ((dst_tab->Flags & ImGuiTabItemFlags_SectionMask_) != (src_tab->Flags & ImGuiTabItemFlags_SectionMask_))
            break;
        dst_idx = i;

        // Include spacing after tab, so when mouse cursor is between tabs we would not continue checking further tabs that are not hovered.
        const float x1 = bar_offset + dst_tab->Offset - g.Style.ItemInnerSpacing.x;
        const float x2 = bar_offset + dst_tab->Offset + dst_tab->Width + g.Style.ItemInnerSpacing.x;
        //GetForegroundDrawList()->AddRect(ImVec2(x1, tab_bar->BarRect.Min.y), ImVec2(x2, tab_bar->BarRect.Max.y), IM_COL32(255, 0, 0, 255));
        if ((dir < 0 && mouse_pos.x > x1) || (dir > 0 && mouse_pos.x < x2))
            break;
    }

    if (dst_idx != src_idx)
        TabBarQueueReorder(tab_bar, src_tab, dst_idx - src_idx);
}